

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwGetWindowContentScale(GLFWwindow *handle,float *xscale,float *yscale)

{
  float *in_RDX;
  float *in_RSI;
  _GLFWwindow *in_RDI;
  _GLFWwindow *window;
  
  if (in_RSI != (float *)0x0) {
    *in_RSI = 0.0;
  }
  if (in_RDX != (float *)0x0) {
    *in_RDX = 0.0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    _glfwPlatformGetWindowContentScale(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowContentScale(GLFWwindow* handle,
                                       float* xscale, float* yscale)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowContentScale(window, xscale, yscale);
}